

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.hpp
# Opt level: O2

internal_node *
pstore::index::details::internal_node::
make_writable<pstore::chunked_sequence<pstore::index::details::internal_node,10922ul,528ul,8ul>,void>
          (chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL> *container,
          index_pointer node,internal_node *internal)

{
  bool bVar1;
  reference pvVar2;
  
  if (((ulong)node.internal_ & 2) == 0) {
    pvVar2 = chunked_sequence<pstore::index::details::internal_node,10922ul,528ul,8ul>::
             emplace_back<pstore::index::details::internal_node_const&>
                       ((chunked_sequence<pstore::index::details::internal_node,10922ul,528ul,8ul> *
                        )container,internal);
    return pvVar2;
  }
  bVar1 = std::operator==(&(node.internal_ & 0xfffffffffffffffcU)->signature_,
                          (array<unsigned_char,_8UL> *)&node_signature_);
  if (bVar1) {
    return node.internal_ & 0xfffffffffffffffcU;
  }
  assert_failed("inode->signature_ == node_signature_",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map_types.hpp"
                ,0x272);
}

Assistant:

static internal_node * make_writable (SequenceContainer * const container,
                                                      index_pointer const node,
                                                      internal_node const & internal) {
                    if (node.is_heap ()) {
                        auto * const inode = node.untag<internal_node *> ();
                        PSTORE_ASSERT (inode->signature_ == node_signature_);
                        return inode;
                    }

                    return allocate (container, internal);
                }